

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O3

uint Assimp::StandardShapes::MakeHexahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,
               bool polygons)

{
  pointer *ppaVar1;
  aiVector3t<float> *paVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  iterator iVar4;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  aiVector3t<float> local_48;
  aiVector3t<float> local_38;
  aiVector3t<float> local_28;
  
  ppaVar1 = &(positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 0x24);
  local_88.x = -0.57735026;
  local_88.y = -0.57735026;
  local_88.z = -0.57735026;
  local_28.x = 0.57735026;
  local_28.y = -0.57735026;
  local_28.z = -0.57735026;
  local_38.x = 0.57735026;
  local_38.y = 0.57735026;
  local_38.z = -0.57735026;
  local_48.x = -0.57735026;
  local_48.y = 0.57735026;
  local_48.z = -0.57735026;
  local_58.x = -0.57735026;
  local_58.y = -0.57735026;
  local_58.z = 0.57735026;
  local_68.x = 0.57735026;
  local_68.y = -0.57735026;
  local_68.z = 0.57735026;
  local_98.x = 0.57735026;
  local_98.y = 0.57735026;
  local_98.z = 0.57735026;
  local_78.x = -0.57735026;
  local_78.y = 0.57735026;
  local_78.z = 0.57735026;
  iVar4._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar2 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((int)CONCAT71(in_register_00000031,polygons) == 0) {
    if (iVar4._M_current == paVar2) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = -0.57735026;
      (iVar4._M_current)->x = -0.57735026;
      (iVar4._M_current)->y = -0.57735026;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    uVar3 = 3;
  }
  else {
    if (iVar4._M_current == paVar2) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = -0.57735026;
      (iVar4._M_current)->x = -0.57735026;
      (iVar4._M_current)->y = -0.57735026;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_88);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_88.z;
      (iVar4._M_current)->x = local_88.x;
      (iVar4._M_current)->y = local_88.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_28);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_28.z;
      (iVar4._M_current)->x = local_28.x;
      (iVar4._M_current)->y = local_28.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_38);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_38.z;
      (iVar4._M_current)->x = local_38.x;
      (iVar4._M_current)->y = local_38.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_48);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_48.z;
      (iVar4._M_current)->x = local_48.x;
      (iVar4._M_current)->y = local_48.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_98);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_98.z;
      (iVar4._M_current)->x = local_98.x;
      (iVar4._M_current)->y = local_98.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_78);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_78.z;
      (iVar4._M_current)->x = local_78.x;
      (iVar4._M_current)->y = local_78.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_58);
      iVar4._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->z = local_58.z;
      (iVar4._M_current)->x = local_58.x;
      (iVar4._M_current)->y = local_58.y;
      iVar4._M_current = *ppaVar1 + 1;
      *ppaVar1 = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar4,
                 &local_68);
    }
    else {
      (iVar4._M_current)->z = local_68.z;
      (iVar4._M_current)->x = local_68.x;
      (iVar4._M_current)->y = local_68.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    uVar3 = 4;
  }
  return uVar3;
}

Assistant:

unsigned int StandardShapes::MakeHexahedron(std::vector<aiVector3D>& positions,
    bool polygons /*= false*/)
{
    positions.reserve(positions.size()+36);
    const ai_real length = ai_real(1.0)/ai_real(1.73205080);

    const aiVector3D v0  = aiVector3D(-1.0,-1.0,-1.0)*length;
    const aiVector3D v1  = aiVector3D(1.0,-1.0,-1.0)*length;
    const aiVector3D v2  = aiVector3D(1.0,1.0,-1.0)*length;
    const aiVector3D v3  = aiVector3D(-1.0,1.0,-1.0)*length;
    const aiVector3D v4  = aiVector3D(-1.0,-1.0,1.0)*length;
    const aiVector3D v5  = aiVector3D(1.0,-1.0,1.0)*length;
    const aiVector3D v6  = aiVector3D(1.0,1.0,1.0)*length;
    const aiVector3D v7  = aiVector3D(-1.0,1.0,1.0)*length;

    ADD_QUAD(v0,v3,v2,v1);
    ADD_QUAD(v0,v1,v5,v4);
    ADD_QUAD(v0,v4,v7,v3);
    ADD_QUAD(v6,v5,v1,v2);
    ADD_QUAD(v6,v2,v3,v7);
    ADD_QUAD(v6,v7,v4,v5);
    return (polygons ? 4 : 3);
}